

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
write_significand<fmt::v11::basic_appender<char>,char,unsigned_long,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,unsigned_long significand,int significand_size,int integral_size
          ,char decimal_point,digit_grouping<char> *grouping)

{
  basic_appender<char> bVar1;
  ulong uVar2;
  unsigned_long uVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> buffer;
  char acStack_268 [32];
  undefined8 local_248;
  long lStack_240;
  undefined8 local_238;
  code *local_230;
  undefined1 local_228 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    if (decimal_point == '\0') {
      do_format_decimal<char,unsigned_long>((char *)&local_248,significand,significand_size);
      pcVar7 = (char *)((long)&local_248 + (long)significand_size);
    }
    else {
      pcVar7 = (char *)((long)&local_248 + (long)significand_size + 1);
      uVar5 = significand_size - integral_size;
      pcVar4 = pcVar7;
      if (1 < (int)uVar5) {
        iVar6 = (uVar5 >> 1) + 1;
        uVar3 = significand;
        do {
          significand = uVar3 / 100;
          *(undefined2 *)(pcVar4 + -2) =
               *(undefined2 *)(digits2(unsigned_long)::data + (uVar3 % 100) * 2);
          pcVar4 = pcVar4 + -2;
          iVar6 = iVar6 + -1;
          uVar3 = significand;
        } while (1 < iVar6);
      }
      uVar2 = significand;
      if ((uVar5 & 1) != 0) {
        uVar2 = significand / 10;
        pcVar4[-1] = (char)significand + (char)uVar2 * -10 | 0x30;
        pcVar4 = pcVar4 + -1;
      }
      pcVar4[-1] = decimal_point;
      do_format_decimal<char,unsigned_long>(pcVar4 + (-1 - (long)integral_size),uVar2,integral_size)
      ;
    }
    bVar1 = copy_noinline<char,char*,fmt::v11::basic_appender<char>>((char *)&local_248,pcVar7,out);
  }
  else {
    local_248 = local_228;
    lStack_240 = 0;
    local_230 = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_238 = 500;
    if (decimal_point == '\0') {
      do_format_decimal<char,unsigned_long>(acStack_268,significand,significand_size);
      pcVar7 = acStack_268 + significand_size;
    }
    else {
      pcVar7 = acStack_268 + (long)significand_size + 1;
      uVar5 = significand_size - integral_size;
      pcVar4 = pcVar7;
      if (1 < (int)uVar5) {
        iVar6 = (uVar5 >> 1) + 1;
        uVar3 = significand;
        do {
          significand = uVar3 / 100;
          *(undefined2 *)(pcVar4 + -2) =
               *(undefined2 *)(digits2(unsigned_long)::data + (uVar3 % 100) * 2);
          pcVar4 = pcVar4 + -2;
          iVar6 = iVar6 + -1;
          uVar3 = significand;
        } while (1 < iVar6);
      }
      uVar2 = significand;
      if ((uVar5 & 1) != 0) {
        uVar2 = significand / 10;
        pcVar4[-1] = (char)significand + (char)uVar2 * -10 | 0x30;
        pcVar4 = pcVar4 + -1;
      }
      pcVar4[-1] = decimal_point;
      do_format_decimal<char,unsigned_long>(pcVar4 + (-1 - (long)integral_size),uVar2,integral_size)
      ;
    }
    copy_noinline<char,char*,fmt::v11::basic_appender<char>>
              (acStack_268,pcVar7,(buffer<char> *)&local_248);
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_248;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,out,digits);
    bVar1 = copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                      (local_248 + integral_size,local_248 + lStack_240,out);
    if (local_248 != local_228) {
      free(local_248);
    }
  }
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(basic_appender<Char>(buffer), significand, significand_size,
                    integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_noinline<Char>(buffer.data() + integral_size,
                                     buffer.end(), out);
}